

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_manager.c
# Opt level: O0

void plugin_manager_iterate
               (plugin_manager manager,_func_int_plugin_manager_plugin_void_ptr *iterator,void *data
               )

{
  set_cb_iterate in_RDX;
  set in_RSI;
  plugin_manager_iterate_cb_type args;
  
  if (in_RSI != (set)0x0) {
    set_iterate(in_RSI,in_RDX,in_RDX);
  }
  return;
}

Assistant:

void plugin_manager_iterate(plugin_manager manager, int (*iterator)(plugin_manager, plugin, void *), void *data)
{
	if (iterator == NULL)
	{
		return;
	}

	struct plugin_manager_iterate_cb_type args = {
		manager,
		iterator,
		data
	};

	set_iterate(manager->plugins, &plugin_manager_iterate_cb, (void *)&args);
}